

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseUnary(StructuralParser *this)

{
  char cVar1;
  bool bVar2;
  Expression *pEVar3;
  TokenType TVar4;
  UnaryOperator *pUVar5;
  Op type;
  Context context;
  Op local_24;
  Context local_20;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27cac9);
  if (bVar2) {
    bVar2 = true;
LAB_001f26b0:
    pEVar3 = parsePreIncDec(this,bVar2);
    return pEVar3;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29f327);
  if (bVar2) {
    bVar2 = false;
    goto LAB_001f26b0;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x29f328,(TokenType)0x27e0c8,(TokenType)0x27e5a2);
  if (!bVar2) {
    pEVar3 = parseFactor(this);
    return pEVar3;
  }
  local_20.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_20.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_20.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_20.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_20.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_20.parentScope = this->currentScope;
  TVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::skip(&this->super_SOULTokeniser);
  cVar1 = *TVar4.text;
  if (cVar1 == '!') {
    local_24 = logicalNot;
  }
  else if (cVar1 == '~') {
    local_24 = bitwiseNot;
  }
  else {
    if (cVar1 != '-') goto LAB_001f2775;
    local_24 = negate;
  }
  if (TVar4.text[1] == '\0') {
    pEVar3 = parseUnary(this);
    pUVar5 = PoolAllocator::
             allocate<soul::AST::UnaryOperator,soul::AST::Context&,soul::AST::Expression&,soul::UnaryOp::Op&>
                       (&this->allocator->pool,&local_20,pEVar3,&local_24);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_20.location.sourceCode.object);
    return &pUVar5->super_Expression;
  }
LAB_001f2775:
  throwInternalCompilerError("getUnaryOpForToken",0x4ce);
}

Assistant:

AST::Expression& parseUnary()
    {
        if (matchIf (Operator::plusplus))    return parsePreIncDec (true);
        if (matchIf (Operator::minusminus))  return parsePreIncDec (false);

        if (matchesAny (Operator::minus, Operator::logicalNot, Operator::bitwiseNot))
        {
            auto context = getContext();
            auto type = getUnaryOpForToken (skip());
            return allocate<AST::UnaryOperator> (context, parseUnary(), type);
        }

        return parseFactor();
    }